

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O2

XMLCh * xercesc_4_0::getBaseAttrValue(DOMNode *node)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  XMLCh *pXVar6;
  long lVar7;
  undefined4 extraout_var;
  
  iVar2 = (*node->_vptr_DOMNode[4])();
  if (iVar2 == 1) {
    iVar2 = (*node->_vptr_DOMNode[0x1a])(node);
    if ((char)iVar2 != '\0') {
      iVar2 = (*node->_vptr_DOMNode[0xb])(node);
      plVar3 = (long *)CONCAT44(extraout_var,iVar2);
      lVar4 = (**(code **)(*plVar3 + 0x28))(plVar3);
      lVar7 = 0;
      while (lVar4 != lVar7) {
        plVar5 = (long *)(**(code **)(*plVar3 + 0x18))(plVar3,lVar7);
        pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0x140))(plVar5);
        bVar1 = XMLString::equals(pXVar6,(XMLCh *)XIncludeUtils::fgXIBaseAttrName);
        lVar7 = lVar7 + 1;
        if (bVar1) {
          pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0x150))(plVar5);
          return pXVar6;
        }
      }
    }
  }
  return (XMLCh *)0x0;
}

Assistant:

static const XMLCh *
getBaseAttrValue(DOMNode *node){
    if (node->getNodeType() == DOMNode::ELEMENT_NODE){
        DOMElement *elem = (DOMElement *)node;
        if(elem->hasAttributes()) {
            /* get all the attributes of the node */
            DOMNamedNodeMap *pAttributes = elem->getAttributes();
            XMLSize_t nSize = pAttributes->getLength();
            for(XMLSize_t i=0;i<nSize;++i) {
                DOMAttr *pAttributeNode = (DOMAttr*) pAttributes->item(i);
                /* get attribute name */
                if (XMLString::equals(pAttributeNode->getName(), XIncludeUtils::fgXIBaseAttrName)){
                    /*if (namespace == XMLUni::fgXMLString){

                    }*/
                    return pAttributeNode->getValue();
                }
            }
        }
    }
    return NULL;
}